

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::updateBtranPSE(HEkkPrimal *this,HVector *col_steepest_edge)

{
  HighsSimplexAnalysis *in_RSI;
  HighsSimplexAnalysis *in_RDI;
  double local_col_steepest_edge_density;
  undefined4 in_stack_ffffffffffffffd8;
  HighsInt in_stack_ffffffffffffffdc;
  HVector *in_stack_ffffffffffffffe8;
  
  HighsSimplexAnalysis::simplexTimerStart
            (in_RSI,(HighsInt)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
             (HighsInt)in_stack_ffffffffffffffe8);
  if ((*(byte *)((long)&(in_RDI->thread_simplex_clocks).
                        super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                        _M_impl.super__Vector_impl_data._M_start[7].clock_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl + 9) & 1) != 0) {
    HighsSimplexAnalysis::operationRecordBefore
              (in_RSI,(HighsInt)((ulong)in_stack_ffffffffffffffe8 >> 0x20),(HVector *)in_RDI,
               (double)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  HSimplexNla::btran((HSimplexNla *)in_RSI,in_stack_ffffffffffffffe8,(double)in_RDI,
                     (HighsTimerClock *)
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if ((*(byte *)((long)&(in_RDI->thread_simplex_clocks).
                        super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                        _M_impl.super__Vector_impl_data._M_start[7].clock_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl + 9) & 1) != 0) {
    HighsSimplexAnalysis::operationRecordAfter(in_RDI,in_stack_ffffffffffffffdc,(HVector *)0x7afd53)
    ;
  }
  HighsSimplexAnalysis::simplexTimerStop
            (in_RSI,(HighsInt)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
             (HighsInt)in_stack_ffffffffffffffe8);
  HEkk::updateOperationResultDensity
            ((HEkk *)in_RDI->timer_,
             ((double)*(int *)((long)&in_RSI->timer_ + 4) * 1.0) /
             (double)*(int *)((long)&(in_RDI->thread_simplex_clocks).
                                     super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 4),
             (double *)(in_RDI->timer_ + 0x4c));
  return;
}

Assistant:

void HEkkPrimal::updateBtranPSE(HVector& col_steepest_edge) {
  analysis->simplexTimerStart(BtranPseClock);
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordBefore(
        kSimplexNlaBtranPse, col_steepest_edge,
        ekk_instance_.info_.col_steepest_edge_density);
  // Perform BTRAN PSE
  ekk_instance_.simplex_nla_.btran(
      col_steepest_edge, ekk_instance_.info_.col_steepest_edge_density,
      analysis->pointer_serial_factor_clocks);
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordAfter(kSimplexNlaBtranPse, col_steepest_edge);
  analysis->simplexTimerStop(BtranPseClock);
  const double local_col_steepest_edge_density =
      (1.0 * col_steepest_edge.count) / num_row;
  ekk_instance_.updateOperationResultDensity(
      local_col_steepest_edge_density,
      ekk_instance_.info_.col_steepest_edge_density);
}